

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void iadst16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  longlong local_198;
  longlong lStack_190;
  longlong lStack_188;
  longlong lStack_180;
  longlong local_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  longlong lStack_e0;
  
  lVar13 = (long)bit * 0x100;
  iVar14 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x168);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 600);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x188);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x238);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1a8);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x218);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1c8);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1f8);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1e8);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1d8);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x208);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  auVar19._4_4_ = iVar14;
  auVar19._0_4_ = iVar14;
  auVar19._8_4_ = iVar14;
  auVar19._12_4_ = iVar14;
  auVar19._16_4_ = iVar14;
  auVar19._20_4_ = iVar14;
  auVar19._24_4_ = iVar14;
  auVar19._28_4_ = iVar14;
  auVar5 = vpmulld_avx2((undefined1  [32])in[0xf],auVar37);
  auVar6 = vpmulld_avx2((undefined1  [32])*in,auVar45);
  auVar5 = vpaddd_avx2(auVar5,auVar19);
  auVar5 = vpaddd_avx2(auVar6,auVar5);
  auVar6 = vpmulld_avx2((undefined1  [32])in[0xf],auVar45);
  auVar37 = vpmulld_avx2(auVar37,(undefined1  [32])*in);
  auVar6 = vpaddd_avx2(auVar6,auVar19);
  auVar45 = vpsubd_avx2(auVar6,auVar37);
  auVar6 = vpmulld_avx2((undefined1  [32])in[0xd],auVar34);
  auVar37 = vpmulld_avx2((undefined1  [32])in[2],auVar42);
  auVar6 = vpaddd_avx2(auVar6,auVar19);
  auVar6 = vpaddd_avx2(auVar6,auVar37);
  auVar37 = vpmulld_avx2((undefined1  [32])in[0xd],auVar42);
  auVar34 = vpmulld_avx2(auVar34,(undefined1  [32])in[2]);
  auVar37 = vpaddd_avx2(auVar37,auVar19);
  auVar42 = vpsubd_avx2(auVar37,auVar34);
  auVar37 = vpmulld_avx2((undefined1  [32])in[0xb],auVar30);
  auVar34 = vpmulld_avx2((undefined1  [32])in[4],auVar40);
  auVar37 = vpaddd_avx2(auVar37,auVar19);
  auVar37 = vpaddd_avx2(auVar37,auVar34);
  auVar34 = vpmulld_avx2((undefined1  [32])in[0xb],auVar40);
  auVar30 = vpmulld_avx2(auVar30,(undefined1  [32])in[4]);
  auVar34 = vpaddd_avx2(auVar34,auVar19);
  auVar40 = vpsubd_avx2(auVar34,auVar30);
  auVar34 = vpmulld_avx2((undefined1  [32])in[9],auVar26);
  auVar30 = vpmulld_avx2((undefined1  [32])in[6],auVar49);
  auVar34 = vpaddd_avx2(auVar34,auVar19);
  auVar34 = vpaddd_avx2(auVar34,auVar30);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1b8);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  auVar30 = vpmulld_avx2((undefined1  [32])in[9],auVar49);
  auVar26 = vpmulld_avx2(auVar26,(undefined1  [32])in[6]);
  auVar30 = vpaddd_avx2(auVar19,auVar30);
  auVar49 = vpsubd_avx2(auVar30,auVar26);
  auVar30 = vpmulld_avx2((undefined1  [32])in[7],auVar35);
  auVar30 = vpaddd_avx2(auVar19,auVar30);
  auVar26 = vpmulld_avx2((undefined1  [32])in[8],auVar46);
  auVar30 = vpaddd_avx2(auVar26,auVar30);
  auVar26 = vpmulld_avx2((undefined1  [32])in[7],auVar46);
  auVar35 = vpmulld_avx2(auVar35,(undefined1  [32])in[8]);
  auVar26 = vpaddd_avx2(auVar19,auVar26);
  auVar46 = vpsubd_avx2(auVar26,auVar35);
  auVar26 = vpmulld_avx2((undefined1  [32])in[5],auVar25);
  auVar26 = vpaddd_avx2(auVar19,auVar26);
  auVar35 = vpmulld_avx2((undefined1  [32])in[10],auVar50);
  auVar26 = vpaddd_avx2(auVar35,auVar26);
  auVar35 = vpmulld_avx2((undefined1  [32])in[5],auVar50);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x228);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  auVar25 = vpmulld_avx2(auVar25,(undefined1  [32])in[10]);
  auVar35 = vpaddd_avx2(auVar19,auVar35);
  auVar50 = vpsubd_avx2(auVar35,auVar25);
  auVar35 = vpmulld_avx2((undefined1  [32])in[3],auVar32);
  auVar35 = vpaddd_avx2(auVar19,auVar35);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x198);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  auVar25 = vpmulld_avx2((undefined1  [32])in[0xc],auVar47);
  auVar35 = vpaddd_avx2(auVar35,auVar25);
  auVar25 = vpmulld_avx2((undefined1  [32])in[3],auVar47);
  auVar32 = vpmulld_avx2(auVar32,(undefined1  [32])in[0xc]);
  auVar25 = vpaddd_avx2(auVar19,auVar25);
  auVar47 = vpsubd_avx2(auVar25,auVar32);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x248);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  auVar25 = vpmulld_avx2((undefined1  [32])in[1],auVar27);
  auVar25 = vpaddd_avx2(auVar19,auVar25);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x178);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar48._16_4_ = uVar1;
  auVar48._20_4_ = uVar1;
  auVar48._24_4_ = uVar1;
  auVar48._28_4_ = uVar1;
  auVar32 = vpmulld_avx2((undefined1  [32])in[0xe],auVar48);
  auVar25 = vpaddd_avx2(auVar32,auVar25);
  auVar32 = vpmulld_avx2((undefined1  [32])in[1],auVar48);
  auVar27 = vpmulld_avx2(auVar27,(undefined1  [32])in[0xe]);
  auVar32 = vpaddd_avx2(auVar19,auVar32);
  auVar48 = vpsubd_avx2(auVar32,auVar27);
  auVar32 = vpsrad_avx2(auVar5,ZEXT416((uint)bit));
  auVar30 = vpsrad_avx2(auVar30,ZEXT416((uint)bit));
  auVar5 = vpaddd_avx2(auVar30,auVar32);
  auVar21 = vpsubd_avx2(auVar32,auVar30);
  auVar24 = ZEXT416((uint)bit);
  auVar32 = vpsrad_avx2(auVar45,auVar24);
  auVar27 = vpsrad_avx2(auVar46,auVar24);
  auVar30 = vpaddd_avx2(auVar27,auVar32);
  auVar45 = vpsubd_avx2(auVar32,auVar27);
  auVar32 = vpsrad_avx2(auVar6,auVar24);
  auVar26 = vpsrad_avx2(auVar26,auVar24);
  auVar6 = vpaddd_avx2(auVar26,auVar32);
  auVar46 = vpsubd_avx2(auVar32,auVar26);
  auVar24 = ZEXT416((uint)bit);
  auVar32 = vpsrad_avx2(auVar42,auVar24);
  auVar27 = vpsrad_avx2(auVar50,auVar24);
  auVar26 = vpaddd_avx2(auVar27,auVar32);
  auVar42 = vpsubd_avx2(auVar32,auVar27);
  auVar32 = vpsrad_avx2(auVar37,auVar24);
  auVar35 = vpsrad_avx2(auVar35,auVar24);
  auVar37 = vpaddd_avx2(auVar35,auVar32);
  auVar50 = vpsubd_avx2(auVar32,auVar35);
  auVar32 = vpsrad_avx2(auVar40,auVar24);
  auVar27 = vpsrad_avx2(auVar47,auVar24);
  auVar35 = vpaddd_avx2(auVar27,auVar32);
  auVar40 = vpsubd_avx2(auVar32,auVar27);
  auVar32 = vpsrad_avx2(auVar34,auVar24);
  auVar25 = vpsrad_avx2(auVar25,auVar24);
  auVar34 = vpaddd_avx2(auVar25,auVar32);
  auVar47 = vpsubd_avx2(auVar32,auVar25);
  auVar24 = ZEXT416((uint)bit);
  auVar32 = vpsrad_avx2(auVar49,auVar24);
  auVar27 = vpsrad_avx2(auVar48,auVar24);
  auVar25 = vpaddd_avx2(auVar27,auVar32);
  auVar32 = vpsubd_avx2(auVar32,auVar27);
  iVar14 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x240);
  iVar16 = -iVar14;
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1c0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  iVar15 = -iVar12;
  iVar17 = -iVar2;
  iVar18 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar11 = 0x8000;
  if (0xf < iVar18) {
    iVar11 = 1 << ((char)iVar18 - 1U & 0x1f);
  }
  iVar18 = -iVar11;
  iVar11 = iVar11 + -1;
  auVar20._4_4_ = iVar14;
  auVar20._0_4_ = iVar14;
  auVar20._8_4_ = iVar14;
  auVar20._12_4_ = iVar14;
  auVar20._16_4_ = iVar14;
  auVar20._20_4_ = iVar14;
  auVar20._24_4_ = iVar14;
  auVar20._28_4_ = iVar14;
  auVar33._4_4_ = iVar18;
  auVar33._0_4_ = iVar18;
  auVar33._8_4_ = iVar18;
  auVar33._12_4_ = iVar18;
  auVar33._16_4_ = iVar18;
  auVar33._20_4_ = iVar18;
  auVar33._24_4_ = iVar18;
  auVar33._28_4_ = iVar18;
  auVar28._4_4_ = iVar11;
  auVar28._0_4_ = iVar11;
  auVar28._8_4_ = iVar11;
  auVar28._12_4_ = iVar11;
  auVar28._16_4_ = iVar11;
  auVar28._20_4_ = iVar11;
  auVar28._24_4_ = iVar11;
  auVar28._28_4_ = iVar11;
  auVar27 = vpmaxsd_avx2(auVar21,auVar33);
  auVar49 = vpminsd_avx2(auVar27,auVar28);
  auVar27 = vpmaxsd_avx2(auVar45,auVar33);
  auVar45 = vpminsd_avx2(auVar27,auVar28);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x180);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar27 = vpmulld_avx2(auVar49,auVar41);
  auVar27 = vpaddd_avx2(auVar27,auVar19);
  auVar48 = vpmulld_avx2(auVar45,auVar20);
  auVar27 = vpaddd_avx2(auVar27,auVar48);
  auVar49 = vpmulld_avx2(auVar49,auVar20);
  auVar48 = vpmulld_avx2(auVar41,auVar45);
  auVar45 = vpaddd_avx2(auVar19,auVar49);
  auVar48 = vpsubd_avx2(auVar45,auVar48);
  auVar21._4_4_ = iVar12;
  auVar21._0_4_ = iVar12;
  auVar21._8_4_ = iVar12;
  auVar21._12_4_ = iVar12;
  auVar21._16_4_ = iVar12;
  auVar21._20_4_ = iVar12;
  auVar21._24_4_ = iVar12;
  auVar21._28_4_ = iVar12;
  auVar45 = vpmaxsd_avx2(auVar46,auVar33);
  auVar49 = vpminsd_avx2(auVar45,auVar28);
  auVar45 = vpmaxsd_avx2(auVar42,auVar33);
  auVar42 = vpminsd_avx2(auVar45,auVar28);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x200);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  auVar45 = vpmulld_avx2(auVar49,auVar43);
  auVar45 = vpaddd_avx2(auVar45,auVar19);
  auVar46 = vpmulld_avx2(auVar42,auVar21);
  auVar45 = vpaddd_avx2(auVar45,auVar46);
  auVar49 = vpmulld_avx2(auVar49,auVar21);
  auVar46 = vpmulld_avx2(auVar43,auVar42);
  auVar42 = vpaddd_avx2(auVar19,auVar49);
  auVar21 = vpsubd_avx2(auVar42,auVar46);
  auVar22._4_4_ = iVar16;
  auVar22._0_4_ = iVar16;
  auVar22._8_4_ = iVar16;
  auVar22._12_4_ = iVar16;
  auVar22._16_4_ = iVar16;
  auVar22._20_4_ = iVar16;
  auVar22._24_4_ = iVar16;
  auVar22._28_4_ = iVar16;
  auVar42 = vpmaxsd_avx2(auVar50,auVar33);
  auVar49 = vpminsd_avx2(auVar42,auVar28);
  auVar42 = vpmaxsd_avx2(auVar40,auVar33);
  auVar40 = vpminsd_avx2(auVar42,auVar28);
  auVar42 = vpmulld_avx2(auVar49,auVar22);
  auVar42 = vpaddd_avx2(auVar19,auVar42);
  auVar46 = vpmulld_avx2(auVar40,auVar41);
  auVar42 = vpaddd_avx2(auVar46,auVar42);
  auVar49 = vpmulld_avx2(auVar49,auVar41);
  auVar46 = vpmulld_avx2(auVar22,auVar40);
  auVar40 = vpaddd_avx2(auVar19,auVar49);
  auVar50 = vpsubd_avx2(auVar40,auVar46);
  auVar23._4_4_ = iVar15;
  auVar23._0_4_ = iVar15;
  auVar23._8_4_ = iVar15;
  auVar23._12_4_ = iVar15;
  auVar23._16_4_ = iVar15;
  auVar23._20_4_ = iVar15;
  auVar23._24_4_ = iVar15;
  auVar23._28_4_ = iVar15;
  auVar40 = vpmaxsd_avx2(auVar33,auVar47);
  auVar40 = vpminsd_avx2(auVar40,auVar28);
  auVar32 = vpmaxsd_avx2(auVar32,auVar33);
  auVar49 = vpminsd_avx2(auVar32,auVar28);
  auVar32 = vpmulld_avx2(auVar40,auVar23);
  auVar32 = vpaddd_avx2(auVar19,auVar32);
  auVar46 = vpmulld_avx2(auVar49,auVar43);
  auVar32 = vpaddd_avx2(auVar46,auVar32);
  auVar40 = vpmulld_avx2(auVar40,auVar43);
  auVar49 = vpmulld_avx2(auVar23,auVar49);
  auVar40 = vpaddd_avx2(auVar19,auVar40);
  auVar49 = vpsubd_avx2(auVar40,auVar49);
  auVar5 = vpmaxsd_avx2(auVar33,auVar5);
  auVar40 = vpminsd_avx2(auVar5,auVar28);
  auVar5 = vpmaxsd_avx2(auVar33,auVar37);
  auVar37 = vpminsd_avx2(auVar5,auVar28);
  auVar5 = vpaddd_avx2(auVar37,auVar40);
  auVar40 = vpsubd_avx2(auVar40,auVar37);
  auVar37 = vpmaxsd_avx2(auVar33,auVar30);
  auVar30 = vpminsd_avx2(auVar37,auVar28);
  auVar37 = vpmaxsd_avx2(auVar33,auVar35);
  auVar35 = vpminsd_avx2(auVar37,auVar28);
  auVar37 = vpaddd_avx2(auVar35,auVar30);
  auVar46 = vpsubd_avx2(auVar30,auVar35);
  auVar6 = vpmaxsd_avx2(auVar33,auVar6);
  auVar30 = vpminsd_avx2(auVar6,auVar28);
  auVar6 = vpmaxsd_avx2(auVar33,auVar34);
  auVar34 = vpminsd_avx2(auVar6,auVar28);
  auVar6 = vpaddd_avx2(auVar34,auVar30);
  auVar47 = vpsubd_avx2(auVar30,auVar34);
  auVar34 = vpmaxsd_avx2(auVar33,auVar26);
  auVar30 = vpminsd_avx2(auVar34,auVar28);
  auVar34 = vpmaxsd_avx2(auVar33,auVar25);
  auVar26 = vpminsd_avx2(auVar34,auVar28);
  auVar34 = vpaddd_avx2(auVar26,auVar30);
  auVar20 = vpsubd_avx2(auVar30,auVar26);
  auVar26 = vpsrad_avx2(auVar27,auVar24);
  auVar35 = vpsrad_avx2(auVar42,auVar24);
  auVar30 = vpaddd_avx2(auVar35,auVar26);
  auVar22 = vpsubd_avx2(auVar26,auVar35);
  auVar35 = vpsrad_avx2(auVar48,auVar24);
  auVar25 = vpsrad_avx2(auVar50,auVar24);
  auVar26 = vpaddd_avx2(auVar25,auVar35);
  auVar50 = vpsubd_avx2(auVar35,auVar25);
  auVar25 = vpsrad_avx2(auVar45,auVar24);
  auVar32 = vpsrad_avx2(auVar32,auVar24);
  auVar35 = vpaddd_avx2(auVar32,auVar25);
  auVar48 = vpsubd_avx2(auVar25,auVar32);
  auVar32 = vpsrad_avx2(auVar21,auVar24);
  auVar27 = vpsrad_avx2(auVar49,auVar24);
  auVar25 = vpaddd_avx2(auVar27,auVar32);
  auVar21 = vpsubd_avx2(auVar32,auVar27);
  auVar36._4_4_ = iVar2;
  auVar36._0_4_ = iVar2;
  auVar36._8_4_ = iVar2;
  auVar36._12_4_ = iVar2;
  auVar36._16_4_ = iVar2;
  auVar36._20_4_ = iVar2;
  auVar36._24_4_ = iVar2;
  auVar36._28_4_ = iVar2;
  auVar32 = vpmaxsd_avx2(auVar40,auVar33);
  auVar27 = vpminsd_avx2(auVar32,auVar28);
  auVar32 = vpmaxsd_avx2(auVar46,auVar33);
  auVar45 = vpminsd_avx2(auVar32,auVar28);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  auVar32 = vpmulld_avx2(auVar27,auVar44);
  auVar32 = vpaddd_avx2(auVar19,auVar32);
  auVar42 = vpmulld_avx2(auVar45,auVar36);
  auVar32 = vpaddd_avx2(auVar42,auVar32);
  auVar27 = vpmulld_avx2(auVar27,auVar36);
  auVar45 = vpmulld_avx2(auVar44,auVar45);
  auVar27 = vpaddd_avx2(auVar19,auVar27);
  auVar23 = vpsubd_avx2(auVar27,auVar45);
  auVar38._4_4_ = iVar17;
  auVar38._0_4_ = iVar17;
  auVar38._8_4_ = iVar17;
  auVar38._12_4_ = iVar17;
  auVar38._16_4_ = iVar17;
  auVar38._20_4_ = iVar17;
  auVar38._24_4_ = iVar17;
  auVar38._28_4_ = iVar17;
  auVar27 = vpmaxsd_avx2(auVar33,auVar47);
  auVar45 = vpminsd_avx2(auVar27,auVar28);
  auVar27 = vpmaxsd_avx2(auVar20,auVar33);
  auVar42 = vpminsd_avx2(auVar27,auVar28);
  auVar27 = vpmulld_avx2(auVar45,auVar38);
  auVar27 = vpaddd_avx2(auVar19,auVar27);
  auVar40 = vpmulld_avx2(auVar42,auVar44);
  auVar27 = vpaddd_avx2(auVar40,auVar27);
  auVar45 = vpmulld_avx2(auVar45,auVar44);
  auVar42 = vpmulld_avx2(auVar38,auVar42);
  auVar45 = vpaddd_avx2(auVar19,auVar45);
  auVar47 = vpsubd_avx2(auVar45,auVar42);
  auVar45 = vpmaxsd_avx2(auVar22,auVar33);
  auVar42 = vpminsd_avx2(auVar45,auVar28);
  auVar45 = vpmaxsd_avx2(auVar50,auVar33);
  auVar40 = vpminsd_avx2(auVar45,auVar28);
  auVar45 = vpmulld_avx2(auVar42,auVar44);
  auVar45 = vpaddd_avx2(auVar45,auVar19);
  auVar49 = vpmulld_avx2(auVar40,auVar36);
  auVar45 = vpaddd_avx2(auVar45,auVar49);
  auVar42 = vpmulld_avx2(auVar42,auVar36);
  auVar40 = vpmulld_avx2(auVar44,auVar40);
  auVar42 = vpaddd_avx2(auVar19,auVar42);
  auVar50 = vpsubd_avx2(auVar42,auVar40);
  auVar42 = vpmaxsd_avx2(auVar48,auVar33);
  auVar40 = vpminsd_avx2(auVar42,auVar28);
  auVar42 = vpmaxsd_avx2(auVar21,auVar33);
  auVar49 = vpminsd_avx2(auVar42,auVar28);
  auVar42 = vpmulld_avx2(auVar40,auVar38);
  auVar42 = vpaddd_avx2(auVar19,auVar42);
  auVar46 = vpmulld_avx2(auVar49,auVar44);
  auVar42 = vpaddd_avx2(auVar46,auVar42);
  auVar40 = vpmulld_avx2(auVar40,auVar44);
  auVar49 = vpmulld_avx2(auVar38,auVar49);
  auVar40 = vpaddd_avx2(auVar19,auVar40);
  auVar49 = vpsubd_avx2(auVar40,auVar49);
  auVar5 = vpmaxsd_avx2(auVar33,auVar5);
  auVar40 = vpminsd_avx2(auVar5,auVar28);
  auVar5 = vpmaxsd_avx2(auVar33,auVar6);
  auVar6 = vpminsd_avx2(auVar5,auVar28);
  auVar5 = vpaddd_avx2(auVar6,auVar40);
  auVar40 = vpsubd_avx2(auVar40,auVar6);
  auVar6 = vpmaxsd_avx2(auVar33,auVar37);
  auVar37 = vpminsd_avx2(auVar6,auVar28);
  auVar6 = vpmaxsd_avx2(auVar33,auVar34);
  auVar34 = vpminsd_avx2(auVar6,auVar28);
  auVar6 = vpaddd_avx2(auVar34,auVar37);
  auVar46 = vpsubd_avx2(auVar37,auVar34);
  auVar34 = vpsrad_avx2(auVar32,auVar24);
  auVar32 = vpsrad_avx2(auVar27,auVar24);
  auVar37 = vpaddd_avx2(auVar32,auVar34);
  auVar48 = vpsubd_avx2(auVar34,auVar32);
  auVar32 = vpsrad_avx2(auVar23,auVar24);
  auVar27 = vpsrad_avx2(auVar47,auVar24);
  auVar34 = vpaddd_avx2(auVar27,auVar32);
  auVar47 = vpsubd_avx2(auVar32,auVar27);
  auVar30 = vpmaxsd_avx2(auVar33,auVar30);
  auVar32 = vpminsd_avx2(auVar30,auVar28);
  auVar30 = vpmaxsd_avx2(auVar33,auVar35);
  auVar35 = vpminsd_avx2(auVar30,auVar28);
  auVar30 = vpaddd_avx2(auVar35,auVar32);
  auVar21 = vpsubd_avx2(auVar32,auVar35);
  auVar26 = vpmaxsd_avx2(auVar33,auVar26);
  auVar35 = vpminsd_avx2(auVar26,auVar28);
  auVar26 = vpmaxsd_avx2(auVar33,auVar25);
  auVar25 = vpminsd_avx2(auVar26,auVar28);
  auVar26 = vpaddd_avx2(auVar25,auVar35);
  auVar20 = vpsubd_avx2(auVar35,auVar25);
  auVar25 = vpsrad_avx2(auVar45,auVar24);
  auVar32 = vpsrad_avx2(auVar42,auVar24);
  auVar35 = vpaddd_avx2(auVar32,auVar25);
  auVar22 = vpsubd_avx2(auVar25,auVar32);
  auVar24 = ZEXT416((uint)bit);
  auVar32 = vpsrad_avx2(auVar50,auVar24);
  auVar27 = vpsrad_avx2(auVar49,auVar24);
  auVar25 = vpaddd_avx2(auVar32,auVar27);
  auVar50 = vpsubd_avx2(auVar32,auVar27);
  auVar5 = vpmaxsd_avx2(auVar5,auVar33);
  auVar32 = vpmaxsd_avx2(auVar40,auVar33);
  auVar6 = vpmaxsd_avx2(auVar6,auVar33);
  auVar27 = vpmaxsd_avx2(auVar46,auVar33);
  auVar37 = vpmaxsd_avx2(auVar37,auVar33);
  auVar45 = vpmaxsd_avx2(auVar33,auVar48);
  auVar34 = vpmaxsd_avx2(auVar34,auVar33);
  auVar42 = vpmaxsd_avx2(auVar33,auVar47);
  auVar30 = vpmaxsd_avx2(auVar33,auVar30);
  auVar40 = vpmaxsd_avx2(auVar33,auVar21);
  auVar26 = vpmaxsd_avx2(auVar33,auVar26);
  auVar49 = vpmaxsd_avx2(auVar33,auVar20);
  auVar35 = vpmaxsd_avx2(auVar33,auVar35);
  auVar46 = vpmaxsd_avx2(auVar33,auVar22);
  auVar25 = vpmaxsd_avx2(auVar25,auVar33);
  auVar50 = vpmaxsd_avx2(auVar33,auVar50);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar28);
  auVar5 = vpminsd_avx2(auVar32,auVar28);
  auVar32 = vpminsd_avx2(auVar6,auVar28);
  auVar6 = vpminsd_avx2(auVar27,auVar28);
  auVar27 = vpminsd_avx2(auVar37,auVar28);
  auVar37 = vpminsd_avx2(auVar45,auVar28);
  auVar45 = vpminsd_avx2(auVar34,auVar28);
  auVar34 = vpminsd_avx2(auVar42,auVar28);
  auVar42 = vpminsd_avx2(auVar30,auVar28);
  auVar30 = vpminsd_avx2(auVar40,auVar28);
  auVar26 = vpminsd_avx2(auVar28,auVar26);
  auVar40 = vpminsd_avx2(auVar28,auVar49);
  alVar4 = (__m256i)vpminsd_avx2(auVar28,auVar35);
  auVar35 = vpminsd_avx2(auVar28,auVar46);
  auVar25 = vpminsd_avx2(auVar25,auVar28);
  auVar49 = vpminsd_avx2(auVar50,auVar28);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29._16_4_ = uVar1;
  auVar29._20_4_ = uVar1;
  auVar29._24_4_ = uVar1;
  auVar29._28_4_ = uVar1;
  auVar5 = vpmulld_avx2(auVar5,auVar29);
  auVar46 = vpmulld_avx2(auVar6,auVar29);
  auVar5 = vpaddd_avx2(auVar19,auVar5);
  auVar6 = vpaddd_avx2(auVar5,auVar46);
  auVar46 = vpsubd_avx2(auVar5,auVar46);
  auVar5 = vpmulld_avx2(auVar37,auVar29);
  auVar34 = vpmulld_avx2(auVar34,auVar29);
  auVar5 = vpaddd_avx2(auVar19,auVar5);
  auVar37 = vpaddd_avx2(auVar34,auVar5);
  auVar50 = vpsubd_avx2(auVar5,auVar34);
  auVar5 = vpmulld_avx2(auVar30,auVar29);
  auVar30 = vpmulld_avx2(auVar40,auVar29);
  auVar5 = vpaddd_avx2(auVar5,auVar19);
  auVar34 = vpaddd_avx2(auVar5,auVar30);
  auVar40 = vpsubd_avx2(auVar5,auVar30);
  auVar5 = vpmulld_avx2(auVar35,auVar29);
  auVar35 = vpmulld_avx2(auVar49,auVar29);
  auVar5 = vpaddd_avx2(auVar5,auVar19);
  auVar30 = vpaddd_avx2(auVar5,auVar35);
  auVar35 = vpsubd_avx2(auVar5,auVar35);
  auVar5 = vpsrad_avx2(auVar6,auVar24);
  alVar7 = (__m256i)vpsrad_avx2(auVar46,auVar24);
  alVar8 = (__m256i)vpsrad_avx2(auVar37,auVar24);
  auVar6 = vpsrad_avx2(auVar50,auVar24);
  alVar9 = (__m256i)vpsrad_avx2(auVar34,auVar24);
  auVar37 = vpsrad_avx2(auVar40,auVar24);
  auVar34 = vpsrad_avx2(auVar30,auVar24);
  alVar10 = (__m256i)vpsrad_avx2(auVar35,auVar24);
  if (do_cols == 0) {
    iVar14 = 10;
    if (10 < bd) {
      iVar14 = bd;
    }
    iVar14 = 0x20 << ((byte)iVar14 & 0x1f);
    iVar12 = -iVar14;
    auVar31._4_4_ = iVar12;
    auVar31._0_4_ = iVar12;
    auVar31._8_4_ = iVar12;
    auVar31._12_4_ = iVar12;
    auVar31._16_4_ = iVar12;
    auVar31._20_4_ = iVar12;
    auVar31._24_4_ = iVar12;
    auVar31._28_4_ = iVar12;
    iVar14 = iVar14 + -1;
    auVar39._4_4_ = iVar14;
    auVar39._0_4_ = iVar14;
    auVar39._8_4_ = iVar14;
    auVar39._12_4_ = iVar14;
    auVar39._16_4_ = iVar14;
    auVar39._20_4_ = iVar14;
    auVar39._24_4_ = iVar14;
    auVar39._28_4_ = iVar14;
    iVar14 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar51._4_4_ = iVar14;
    auVar51._0_4_ = iVar14;
    auVar51._8_4_ = iVar14;
    auVar51._12_4_ = iVar14;
    auVar51._16_4_ = iVar14;
    auVar51._20_4_ = iVar14;
    auVar51._24_4_ = iVar14;
    auVar51._28_4_ = iVar14;
    auVar30 = vpaddd_avx2((undefined1  [32])alVar3,auVar51);
    auVar35 = vpsubd_avx2(auVar51,auVar42);
    auVar30 = vpsrad_avx2(auVar30,ZEXT416((uint)out_shift));
    auVar35 = vpsrad_avx2(auVar35,ZEXT416((uint)out_shift));
    auVar30 = vpmaxsd_avx2(auVar30,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar30,auVar39);
    *out = alVar3;
    auVar30 = vpmaxsd_avx2(auVar35,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar30,auVar39);
    out[1] = alVar3;
    auVar30 = vpaddd_avx2((undefined1  [32])alVar4,auVar51);
    auVar35 = vpsubd_avx2(auVar51,auVar27);
    auVar24 = ZEXT416((uint)out_shift);
    auVar30 = vpsrad_avx2(auVar30,auVar24);
    auVar35 = vpsrad_avx2(auVar35,auVar24);
    auVar30 = vpmaxsd_avx2(auVar30,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar30,auVar39);
    out[2] = alVar3;
    auVar30 = vpmaxsd_avx2(auVar35,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar30,auVar39);
    out[3] = alVar3;
    auVar30 = vpaddd_avx2(auVar51,(undefined1  [32])alVar8);
    auVar35 = vpsubd_avx2(auVar51,auVar34);
    auVar34 = vpsrad_avx2(auVar30,auVar24);
    auVar30 = vpsrad_avx2(auVar35,auVar24);
    auVar34 = vpmaxsd_avx2(auVar34,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar34,auVar39);
    out[4] = alVar3;
    auVar34 = vpmaxsd_avx2(auVar30,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar34,auVar39);
    out[5] = alVar3;
    auVar34 = vpaddd_avx2((undefined1  [32])alVar9,auVar51);
    auVar30 = vpsubd_avx2(auVar51,auVar5);
    auVar24 = ZEXT416((uint)out_shift);
    auVar5 = vpsrad_avx2(auVar34,auVar24);
    auVar34 = vpsrad_avx2(auVar30,auVar24);
    auVar5 = vpmaxsd_avx2(auVar5,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[6] = alVar3;
    auVar5 = vpmaxsd_avx2(auVar34,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[7] = alVar3;
    auVar5 = vpaddd_avx2(auVar51,(undefined1  [32])alVar7);
    auVar37 = vpsubd_avx2(auVar51,auVar37);
    auVar5 = vpsrad_avx2(auVar5,auVar24);
    auVar37 = vpsrad_avx2(auVar37,auVar24);
    auVar5 = vpmaxsd_avx2(auVar5,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[8] = alVar3;
    auVar5 = vpmaxsd_avx2(auVar37,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[9] = alVar3;
    auVar5 = vpaddd_avx2(auVar51,(undefined1  [32])alVar10);
    auVar6 = vpsubd_avx2(auVar51,auVar6);
    auVar5 = vpsrad_avx2(auVar5,auVar24);
    auVar6 = vpsrad_avx2(auVar6,auVar24);
    auVar5 = vpmaxsd_avx2(auVar5,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[10] = alVar3;
    auVar5 = vpmaxsd_avx2(auVar6,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[0xb] = alVar3;
    auVar5 = vpaddd_avx2(auVar51,auVar45);
    auVar6 = vpsubd_avx2(auVar51,auVar25);
    auVar5 = vpsrad_avx2(auVar5,auVar24);
    auVar6 = vpsrad_avx2(auVar6,auVar24);
    auVar5 = vpmaxsd_avx2(auVar5,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[0xc] = alVar3;
    auVar5 = vpmaxsd_avx2(auVar6,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    out[0xd] = alVar3;
    auVar5 = vpaddd_avx2(auVar51,auVar26);
    auVar6 = vpsubd_avx2(auVar51,auVar32);
    auVar5 = vpsrad_avx2(auVar5,ZEXT416((uint)out_shift));
    auVar6 = vpsrad_avx2(auVar6,ZEXT416((uint)out_shift));
    auVar5 = vpmaxsd_avx2(auVar5,auVar31);
    auVar6 = vpmaxsd_avx2(auVar6,auVar31);
    alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar39);
    alVar4 = (__m256i)vpminsd_avx2(auVar6,auVar39);
    out[0xe] = alVar3;
    out[0xf] = alVar4;
  }
  else {
    *out = alVar3;
    auVar30 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar42);
    out[1] = alVar3;
    out[2] = alVar4;
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar27);
    out[3] = alVar3;
    out[4] = alVar8;
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar34);
    out[5] = alVar3;
    out[6] = alVar9;
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar5);
    out[7] = alVar3;
    out[8] = alVar7;
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar37);
    out[9] = alVar3;
    out[10] = alVar10;
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar6);
    out[0xb] = alVar3;
    local_f8 = auVar45._0_8_;
    lStack_f0 = auVar45._8_8_;
    lStack_e8 = auVar45._16_8_;
    lStack_e0 = auVar45._24_8_;
    out[0xc][0] = local_f8;
    out[0xc][1] = lStack_f0;
    out[0xc][2] = lStack_e8;
    out[0xc][3] = lStack_e0;
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar25);
    out[0xd] = alVar3;
    local_198 = auVar26._0_8_;
    lStack_190 = auVar26._8_8_;
    lStack_188 = auVar26._16_8_;
    lStack_180 = auVar26._24_8_;
    out[0xe][0] = local_198;
    out[0xe][1] = lStack_190;
    out[0xe][2] = lStack_188;
    out[0xe][3] = lStack_180;
    alVar3 = (__m256i)vpsubd_avx2(auVar30,auVar32);
    out[0xf] = alVar3;
  }
  return;
}

Assistant:

static void iadst16_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m256i x1[16];
  x1[0] = input[15];
  x1[1] = input[0];
  x1[2] = input[13];
  x1[3] = input[2];
  x1[4] = input[11];
  x1[5] = input[4];
  x1[6] = input[9];
  x1[7] = input[6];
  x1[8] = input[7];
  x1[9] = input[8];
  x1[10] = input[5];
  x1[11] = input[10];
  x1[12] = input[3];
  x1[13] = input[12];
  x1[14] = input[1];
  x1[15] = input[14];

  // stage 2
  btf_16_w16_avx2(cospi_p02_p62, cospi_p62_m02, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p10_p54, cospi_p54_m10, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p18_p46, cospi_p46_m18, &x1[4], &x1[5], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p26_p38, cospi_p38_m26, &x1[6], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p34_p30, cospi_p30_m34, &x1[8], &x1[9], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p42_p22, cospi_p22_m42, &x1[10], &x1[11], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p50_p14, cospi_p14_m50, &x1[12], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p58_p06, cospi_p06_m58, &x1[14], &x1[15], _r,
                  INV_COS_BIT);

  iadst16_stage3_avx2(x1);
  iadst16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage5_avx2(x1);
  iadst16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage7_avx2(x1);
  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}